

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O2

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
Response::Response(Response *this,Response *response)

{
  element_type *peVar1;
  allocator<char> local_11;
  
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->streambuf,(response->streambuf).max_size_,&local_11);
  std::
  __shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->shared).
                  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2>
                 ,&(response->shared).
                   super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __weak_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ::__weak_ptr(&(this->connection_weak).
                super___weak_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
               ,&(response->connection_weak).
                 super___weak_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
              );
  peVar1 = (this->shared).
           super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this->http_version = &peVar1->http_version;
  this->status_code = &peVar1->status_code;
  this->header = &peVar1->header;
  Content::Content(&this->content,&this->streambuf);
  return;
}

Assistant:

Response(const Response &response) noexcept
          : streambuf(response.streambuf.max_size()), shared(response.shared), connection_weak(response.connection_weak), http_version(shared->http_version), status_code(shared->status_code), header(shared->header), content(streambuf) {}